

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  bool bVar3;
  stbi_uc sVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  float *output;
  byte *pbVar10;
  stbi_uc *psVar11;
  uint uVar12;
  long lVar13;
  byte bVar14;
  uint c;
  int iVar15;
  stbi_uc *psVar16;
  uint a;
  stbi_uc sVar17;
  float *output_00;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  char *local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  float *local_488;
  stbi_uc *local_480;
  ulong local_478;
  long local_470;
  ulong local_468;
  ulong local_460;
  long local_458;
  ulong local_450;
  long local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  byte local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar15 = req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      local_490 = CONCAT44(local_490._4_4_,req_comp);
      bVar3 = false;
      do {
        auVar18[0] = -(cStack_431 == '3');
        auVar18[1] = -(cStack_430 == '2');
        auVar18[2] = -(cStack_42f == '-');
        auVar18[3] = -(cStack_42e == 'b');
        auVar18[4] = -(cStack_42d == 'i');
        auVar18[5] = -(cStack_42c == 't');
        auVar18[6] = -(cStack_42b == '_');
        auVar18[7] = -(cStack_42a == 'r');
        auVar18[8] = -(cStack_429 == 'l');
        auVar18[9] = -(cStack_428 == 'e');
        auVar18[10] = -(cStack_427 == '_');
        auVar18[0xb] = -(cStack_426 == 'r');
        auVar18[0xc] = -(cStack_425 == 'g');
        auVar18[0xd] = -(cStack_424 == 'b');
        auVar18[0xe] = -(cStack_423 == 'e');
        auVar18[0xf] = -(cStack_422 == '\0');
        auVar19[0] = -(local_438 == 'F');
        auVar19[1] = -(cStack_437 == 'O');
        auVar19[2] = -(cStack_436 == 'R');
        auVar19[3] = -(cStack_435 == 'M');
        auVar19[4] = -(cStack_434 == 'A');
        auVar19[5] = -(cStack_433 == 'T');
        auVar19[6] = -(cStack_432 == '=');
        auVar19[7] = -(cStack_431 == '3');
        auVar19[8] = -(cStack_430 == '2');
        auVar19[9] = -(cStack_42f == '-');
        auVar19[10] = -(cStack_42e == 'b');
        auVar19[0xb] = -(cStack_42d == 'i');
        auVar19[0xc] = -(cStack_42c == 't');
        auVar19[0xd] = -(cStack_42b == '_');
        auVar19[0xe] = -(cStack_42a == 'r');
        auVar19[0xf] = -(cStack_429 == 'l');
        auVar19 = auVar19 & auVar18;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
          bVar3 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar3) {
        local_4a0 = &local_438;
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_4a0 = &cStack_435;
          uVar8 = strtol(local_4a0,&local_4a0,10);
          local_4a0 = local_4a0 + -1;
          do {
            pcVar7 = local_4a0;
            local_4a0 = pcVar7 + 1;
          } while (pcVar7[1] == ' ');
          iVar5 = strncmp(local_4a0,"+X ",3);
          if (iVar5 == 0) {
            local_4a0 = pcVar7 + 4;
            uVar9 = strtol(local_4a0,(char **)0x0,10);
            a = (uint)uVar9;
            *x = a;
            uVar6 = (uint)uVar8;
            *y = uVar6;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            c = 3;
            if ((uint)local_490 != 0) {
              c = (uint)local_490;
            }
            if (((int)(a | uVar6) < 0) ||
               ((((uVar6 != 0 && ((int)(0x7fffffff / (uVar8 & 0xffffffff)) < (int)a)) ||
                 (uVar12 = a * uVar6, (int)(uVar12 | c) < 0)) ||
                (((int)(0x7fffffff / (ulong)c) < (int)uVar12 || (0x1fffffff < uVar12 * c)))))) {
              pcVar7 = "too large";
            }
            else {
              local_490 = uVar8;
              output = (float *)stbi__malloc_mad4(a,uVar6,c,uVar12 * c,iVar15);
              if (output != (float *)0x0) {
                iVar15 = 0;
                if (a - 0x8000 < 0xffff8008) goto LAB_0014ab93;
                if ((int)local_490 < 1) {
                  psVar16 = (stbi_uc *)0x0;
                }
                else {
                  psVar1 = s->buffer_start;
                  psVar2 = s->buffer_start + 1;
                  local_450 = (ulong)(a * 4);
                  local_460 = local_490 & 0x7fffffff;
                  local_468 = uVar9 & 0x7fffffff;
                  local_458 = (uVar9 & 0xffffffff) * (long)(int)c * 4;
                  local_448 = (long)(int)c << 2;
                  local_478 = 0;
                  psVar16 = (stbi_uc *)0x0;
                  local_488 = output;
                  do {
                    psVar11 = s->img_buffer;
                    if (psVar11 < s->img_buffer_end) {
LAB_0014a651:
                      s->img_buffer = psVar11 + 1;
                      sVar4 = *psVar11;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar2;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar15;
                        }
                        psVar11 = s->img_buffer;
                        goto LAB_0014a651;
                      }
                      sVar4 = '\0';
                    }
                    psVar11 = s->img_buffer;
                    if (psVar11 < s->img_buffer_end) {
LAB_0014a6cf:
                      s->img_buffer = psVar11 + 1;
                      sVar17 = *psVar11;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar2;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar15;
                        }
                        psVar11 = s->img_buffer;
                        goto LAB_0014a6cf;
                      }
                      sVar17 = '\0';
                    }
                    pbVar10 = s->img_buffer;
                    if (pbVar10 < s->img_buffer_end) {
LAB_0014a74d:
                      s->img_buffer = pbVar10 + 1;
                      bVar14 = *pbVar10;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar2;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar15;
                        }
                        pbVar10 = s->img_buffer;
                        goto LAB_0014a74d;
                      }
                      bVar14 = 0;
                    }
                    if (((sVar4 != '\x02') || (sVar17 != '\x02')) || ((char)bVar14 < '\0')) {
                      local_440 = sVar4;
                      local_43f = sVar17;
                      local_43e = bVar14;
                      local_43d = stbi__get8(s);
                      stbi__hdr_convert(output,&local_440,c);
                      free(psVar16);
                      iVar15 = 0;
                      iVar5 = 1;
                      do {
                        stbi__getn(s,local_43c,4);
                        stbi__hdr_convert(output + (long)(int)(c * a * iVar15) +
                                                   (long)(int)(iVar5 * c),local_43c,c);
                        iVar5 = iVar5 + 1;
                        while ((int)a <= iVar5) {
                          iVar15 = iVar15 + 1;
LAB_0014ab93:
                          iVar5 = 0;
                          if ((int)(uint)local_490 <= iVar15) {
                            return output;
                          }
                        }
                      } while( true );
                    }
                    pbVar10 = s->img_buffer;
                    if (pbVar10 < s->img_buffer_end) {
LAB_0014a7dc:
                      s->img_buffer = pbVar10 + 1;
                      uVar6 = (uint)*pbVar10;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar2;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar15;
                        }
                        pbVar10 = s->img_buffer;
                        goto LAB_0014a7dc;
                      }
                      uVar6 = 0;
                    }
                    if (((uint)bVar14 << 8 | uVar6) != a) {
                      free(output);
                      free(psVar16);
                      pcVar7 = "invalid decoded scanline length";
                      goto LAB_0014a48e;
                    }
                    if (psVar16 == (stbi_uc *)0x0) {
                      if ((int)a < 0x20000000) {
                        psVar16 = (stbi_uc *)malloc(local_450);
                      }
                      else {
                        psVar16 = (stbi_uc *)0x0;
                      }
                      if (psVar16 == (stbi_uc *)0x0) {
                        free(output);
                        goto LAB_0014ab85;
                      }
                    }
                    local_470 = 0;
                    local_498 = psVar16;
                    local_480 = psVar16;
                    do {
                      if (0 < (int)a) {
                        iVar15 = 0;
                        uVar8 = uVar9 & 0xffffffff;
                        do {
                          pbVar10 = s->img_buffer;
                          if (pbVar10 < s->img_buffer_end) {
LAB_0014a8b9:
                            s->img_buffer = pbVar10 + 1;
                            uVar6 = (uint)*pbVar10;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              if (iVar5 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar1;
                                s->img_buffer_end = psVar2;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar1;
                                s->img_buffer_end = psVar1 + iVar5;
                              }
                              pbVar10 = s->img_buffer;
                              goto LAB_0014a8b9;
                            }
                            uVar6 = 0;
                          }
                          psVar16 = local_480;
                          if ((byte)uVar6 < 0x81) {
                            if ((uint)uVar8 < uVar6) goto LAB_0014aae1;
                            if (uVar6 != 0) {
                              lVar13 = 0;
                              do {
                                psVar11 = s->img_buffer;
                                if (psVar11 < s->img_buffer_end) {
LAB_0014a9a5:
                                  s->img_buffer = psVar11 + 1;
                                  sVar4 = *psVar11;
                                }
                                else {
                                  if (s->read_from_callbacks != 0) {
                                    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen
                                                           );
                                    if (iVar5 == 0) {
                                      s->read_from_callbacks = 0;
                                      s->img_buffer = psVar1;
                                      s->img_buffer_end = psVar2;
                                      s->buffer_start[0] = '\0';
                                    }
                                    else {
                                      s->img_buffer = psVar1;
                                      s->img_buffer_end = psVar1 + iVar5;
                                    }
                                    psVar11 = s->img_buffer;
                                    goto LAB_0014a9a5;
                                  }
                                  sVar4 = '\0';
                                }
                                psVar16[lVar13 * 4 + (long)iVar15 * 4] = sVar4;
                                lVar13 = lVar13 + 1;
                              } while (uVar6 != (uint)lVar13);
                              iVar15 = iVar15 + (uint)lVar13;
                            }
                          }
                          else {
                            psVar16 = s->img_buffer;
                            if (psVar16 < s->img_buffer_end) {
LAB_0014a9f1:
                              s->img_buffer = psVar16 + 1;
                              sVar4 = *psVar16;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                if (iVar5 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar2;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar5;
                                }
                                psVar16 = s->img_buffer;
                                goto LAB_0014a9f1;
                              }
                              sVar4 = '\0';
                            }
                            if ((uint)uVar8 < (uVar6 & 0x7f)) {
LAB_0014aae1:
                              free(output);
                              free(local_498);
                              pcVar7 = "corrupt";
                              goto LAB_0014a48e;
                            }
                            if ((uVar6 & 0x7f) != 0) {
                              lVar13 = 0;
                              do {
                                local_480[lVar13 * 4 + (long)iVar15 * 4] = sVar4;
                                lVar13 = lVar13 + 1;
                              } while ((uVar6 & 0x7f) != (uint)lVar13);
                              iVar15 = iVar15 + (uint)lVar13;
                            }
                          }
                          uVar8 = (ulong)(a - iVar15);
                        } while (a - iVar15 != 0 && iVar15 <= (int)a);
                      }
                      local_470 = local_470 + 1;
                      local_480 = local_480 + 1;
                    } while (local_470 != 4);
                    local_470 = 4;
                    psVar16 = local_498;
                    uVar8 = local_468;
                    output_00 = local_488;
                    if (0 < (int)a) {
                      do {
                        stbi__hdr_convert(output_00,psVar16,c);
                        output_00 = (float *)((long)output_00 + local_448);
                        psVar16 = psVar16 + 4;
                        uVar8 = uVar8 - 1;
                      } while (uVar8 != 0);
                    }
                    local_478 = local_478 + 1;
                    local_488 = (float *)((long)local_488 + local_458);
                    psVar16 = local_498;
                  } while (local_478 != local_460);
                }
                if (psVar16 == (stbi_uc *)0x0) {
                  return output;
                }
                free(psVar16);
                return output;
              }
LAB_0014ab85:
              pcVar7 = "outofmem";
            }
            goto LAB_0014a48e;
          }
        }
        pcVar7 = "unsupported data layout";
        goto LAB_0014a48e;
      }
    }
    pcVar7 = "unsupported format";
  }
  else {
    pcVar7 = "not HDR";
  }
LAB_0014a48e:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar7;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}